

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall
Centaurus::NFABaseState<wchar_t,_Centaurus::IndexVector>::print
          (NFABaseState<wchar_t,_Centaurus::IndexVector> *this,wostream *os,int from)

{
  pointer pNVar1;
  wostream *pwVar2;
  NFATransition<wchar_t> *t;
  pointer pNVar3;
  wchar_t *pwVar4;
  
  pNVar1 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar3 = (this->m_transitions).
                super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar3 != pNVar1; pNVar3 = pNVar3 + 1) {
    pwVar2 = std::operator<<(os,L"S");
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,from);
    pwVar2 = std::operator<<(pwVar2,L" -> ");
    pwVar2 = std::operator<<(pwVar2,L"S");
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,pNVar3->m_dest);
    std::operator<<(pwVar2,L" [ label=\"");
    operator<<(os,&pNVar3->m_label);
    pwVar4 = L"\" ];";
    if (pNVar3->m_long != false) {
      pwVar4 = L"\", penwidth=3, arrowsize=3 ];";
    }
    pwVar2 = std::operator<<(os,pwVar4);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  }
  return;
}

Assistant:

virtual void print(std::wostream& os, int from) const
	{
		for (const auto& t : m_transitions)
		{
			os << L"S" << from << L" -> " << L"S" << t.dest() << L" [ label=\"";
			os << t.label();
            if (!t.is_long())
            {
                os << L"\" ];" << std::endl;
            }
            else
            {
                os << L"\", penwidth=3, arrowsize=3 ];" << std::endl;
            }
		}
	}